

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ma_uint32 *pmVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  ma_uint64 mVar5;
  size_t sVar6;
  ulong uVar7;
  ma_uint32 *pmVar8;
  ma_int32 *pmVar9;
  int iVar10;
  int iVar11;
  ma_uint32 *pmVar12;
  ma_uint64 mVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ma_uint32 mVar17;
  uint uVar18;
  ma_uint8 header [4];
  short local_6c;
  byte local_6a;
  ma_uint32 *local_68;
  long local_60;
  
  pmVar1 = &(pWav->ima).cachedFrameCount;
  mVar13 = 0;
  pmVar8 = (ma_uint32 *)framesToRead;
LAB_00153baf:
  do {
    local_68 = pmVar8;
    mVar5 = mVar13;
    if (pWav->totalPCMFrameCount <= pWav->readCursorInPCMFrames) {
      return mVar5;
    }
    mVar17 = (pWav->ima).cachedFrameCount;
    pmVar8 = local_68;
    mVar13 = mVar5;
    if ((mVar17 == 0) && (mVar17 = 0, (pWav->ima).bytesRemainingInBlock == 0)) {
      if (pWav->channels == 1) {
        sVar6 = (*pWav->onRead)(pWav->pUserData,header,4);
        if (sVar6 != 4) {
          return mVar5;
        }
        mVar17 = (pWav->fmt).blockAlign - 4;
        (pWav->ima).bytesRemainingInBlock = mVar17;
        if (0x58 < header[2]) {
LAB_00154005:
          (*pWav->onSeek)(pWav->pUserData,mVar17,ma_dr_wav_seek_origin_current);
          (pWav->ima).bytesRemainingInBlock = 0;
          return mVar5;
        }
        (pWav->ima).predictor[0] = (int)(short)header._0_2_;
        (pWav->ima).stepIndex[0] = (uint)header[2];
        (pWav->ima).cachedFrames[0xf] = (int)(short)header._0_2_;
      }
      else {
        sVar6 = (*pWav->onRead)(pWav->pUserData,header,8);
        if (sVar6 != 8) {
          return mVar5;
        }
        mVar17 = (pWav->fmt).blockAlign - 8;
        (pWav->ima).bytesRemainingInBlock = mVar17;
        if ((0x58 < header[2]) || (0x58 < local_6a)) goto LAB_00154005;
        (pWav->ima).predictor[0] = (int)(short)header._0_2_;
        (pWav->ima).stepIndex[0] = (uint)header[2];
        (pWav->ima).predictor[1] = (int)local_6c;
        (pWav->ima).stepIndex[1] = (uint)local_6a;
        (pWav->ima).cachedFrames[0xe] = (int)(short)header._0_2_;
        (pWav->ima).cachedFrames[0xf] = (int)local_6c;
      }
      (pWav->ima).cachedFrameCount = 1;
      mVar17 = 1;
    }
    while( true ) {
      if (pmVar8 == (ma_uint32 *)0x0) {
        return mVar5 + (long)local_68;
      }
      if (mVar17 == 0) break;
      uVar7 = pWav->readCursorInPCMFrames;
      if (pWav->totalPCMFrameCount <= uVar7) goto LAB_00153baf;
      if (pBufferOut == (ma_int16 *)0x0) {
        pBufferOut = (ma_int16 *)0x0;
      }
      else {
        uVar14 = 0;
        while( true ) {
          uVar3 = pWav->channels;
          if (uVar3 <= uVar14) break;
          pBufferOut[uVar14] = (ma_int16)pmVar1[uVar14 - mVar17 * uVar3];
          uVar14 = uVar14 + 1;
        }
        pBufferOut = pBufferOut + uVar3;
      }
      pWav->readCursorInPCMFrames = uVar7 + 1;
      (pWav->ima).cachedFrameCount = mVar17 - 1;
      pmVar8 = (ma_uint32 *)((long)pmVar8 - 1);
      mVar13 = mVar13 + 1;
      mVar17 = mVar17 - 1;
    }
    if ((pWav->ima).bytesRemainingInBlock != 0) {
      (pWav->ima).cachedFrameCount = 8;
      uVar7 = (ulong)pWav->channels;
      local_60 = 0x10;
      local_68 = pmVar1;
      for (uVar14 = 0; uVar14 < uVar7; uVar14 = uVar14 + 1) {
        sVar6 = (*pWav->onRead)(pWav->pUserData,header,4);
        if (sVar6 != 4) {
          (pWav->ima).cachedFrameCount = 0;
          return mVar13;
        }
        (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
        uVar3 = pWav->channels;
        uVar7 = (ulong)uVar3;
        pmVar9 = (pWav->ima).cachedFrames + uVar7 + local_60;
        pmVar12 = local_68;
        for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
          bVar2 = header[lVar15];
          uVar18 = bVar2 & 0xf;
          iVar16 = (pWav->ima).stepIndex[uVar14];
          uVar4 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable[iVar16];
          iVar10 = ((int)(uVar18 << 0x1d) >> 0x1f & uVar4) +
                   ((int)uVar4 >> 1 & (int)(uVar18 << 0x1e) >> 0x1f) +
                   ((int)uVar4 >> 2 & -(bVar2 & 1)) + ((int)uVar4 >> 3);
          iVar11 = -iVar10;
          if ((byte)uVar18 < 8) {
            iVar11 = iVar10;
          }
          mVar17 = iVar11 + (pWav->ima).predictor[uVar14];
          if (0x7ffe < (int)mVar17) {
            mVar17 = 0x7fff;
          }
          if ((int)mVar17 < -0x7fff) {
            mVar17 = 0xffff8000;
          }
          (pWav->ima).predictor[uVar14] = mVar17;
          iVar16 = iVar16 + ma_dr_wav_read_pcm_frames_s16__ima::indexTable[uVar18];
          if (0x57 < iVar16) {
            iVar16 = 0x58;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          (pWav->ima).stepIndex[uVar14] = iVar16;
          pmVar12[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar3)] = mVar17;
          iVar16 = (pWav->ima).stepIndex[uVar14];
          uVar4 = ma_dr_wav_read_pcm_frames_s16__ima::stepTable[iVar16];
          iVar10 = ((int)((uint)bVar2 << 0x19) >> 0x1f & uVar4) + ((int)uVar4 >> 3) +
                   ((int)uVar4 >> 2 & -(uint)((bVar2 >> 4 & 1) != 0)) +
                   ((int)uVar4 >> 1 & (int)((uint)bVar2 << 0x1a) >> 0x1f);
          iVar11 = -iVar10;
          if (-1 < (char)bVar2) {
            iVar11 = iVar10;
          }
          iVar11 = iVar11 + (pWav->ima).predictor[uVar14];
          if (0x7ffe < iVar11) {
            iVar11 = 0x7fff;
          }
          if (iVar11 < -0x7fff) {
            iVar11 = -0x8000;
          }
          (pWav->ima).predictor[uVar14] = iVar11;
          iVar16 = iVar16 + ma_dr_wav_read_pcm_frames_s16__ima::indexTable[bVar2 >> 4];
          if (0x57 < iVar16) {
            iVar16 = 0x58;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          (pWav->ima).stepIndex[uVar14] = iVar16;
          pmVar9[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar3)] = iVar11;
          pmVar9 = (ma_int32 *)((long)pmVar9 + (ulong)((uint)uVar3 * 8));
          pmVar12 = (ma_uint32 *)((long)pmVar12 + (ulong)((uint)uVar3 * 8));
        }
        local_60 = local_60 + 1;
        local_68 = local_68 + 1;
      }
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__ima(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint32 iChannel;
    static ma_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };
    static ma_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17,
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45,
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118,
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066,
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899,
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767
    };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = (ma_int16)ma_dr_wav_bytes_to_u16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                ma_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                if (header[2] >= ma_dr_wav_countof(stepTable) || header[6] >= ma_dr_wav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, ma_dr_wav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead;
                }
                pWav->ima.predictor[0] = ma_dr_wav_bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = ma_dr_wav_clamp(header[2], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.predictor[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = ma_dr_wav_clamp(header[6], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[ma_dr_wav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->ima.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    ma_uint32 iByte;
                    ma_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;
                    for (iByte = 0; iByte < 4; ++iByte) {
                        ma_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        ma_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);
                        ma_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        ma_int32 predictor = pWav->ima.predictor[iChannel];
                        ma_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;
                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];
                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;
                        predictor = ma_dr_wav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = ma_dr_wav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (ma_int32)ma_dr_wav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(ma_dr_wav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }
    return totalFramesRead;
}